

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-eval-util.hh
# Opt level: O2

vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> * __thiscall
tinyusdz::lerp<std::array<double,3ul>>
          (vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
           *__return_storage_ptr__,tinyusdz *this,
          vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *a,
          vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *b,double t)

{
  double *pdVar1;
  pointer paVar2;
  ulong __new_size;
  ulong uVar3;
  double3 *b_00;
  long lVar4;
  bool bVar5;
  double3 local_48;
  
  (__return_storage_ptr__->
  super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  __new_size = (*(long *)(this + 8) - *(long *)this) / 0x18;
  uVar3 = ((long)(a->
                 super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
          (long)(a->
                super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                )._M_impl.super__Vector_impl_data._M_start) / 0x18;
  if (uVar3 < __new_size) {
    __new_size = uVar3;
  }
  if (__new_size != 0) {
    std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::resize
              (__return_storage_ptr__,__new_size);
    b_00 = (double3 *)
           ((long)(a->
                  super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
           (long)(a->
                 super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                 )._M_impl.super__Vector_impl_data._M_start);
    if ((double3 *)(*(long *)(this + 8) - *(long *)this) == b_00) {
      lVar4 = 0;
      while (bVar5 = __new_size != 0, __new_size = __new_size - 1, bVar5) {
        lerp<std::array<double,3ul>>
                  (&local_48,(tinyusdz *)(*(long *)this + lVar4),
                   (double3 *)
                   ((long)((a->
                           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar4),b_00,t);
        paVar2 = (__return_storage_ptr__->
                 super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        *(double *)((long)paVar2->_M_elems + lVar4 + 0x10) = local_48._M_elems[2];
        pdVar1 = (double *)((long)paVar2->_M_elems + lVar4);
        *pdVar1 = local_48._M_elems[0];
        pdVar1[1] = local_48._M_elems[1];
        lVar4 = lVar4 + 0x18;
        b_00 = (double3 *)local_48._M_elems[2];
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<T> lerp(const std::vector<T> &a, const std::vector<T> &b,
                           const double t) {
  std::vector<T> dst;

  // Choose shorter one
  size_t n = std::min(a.size(), b.size());
  if (n == 0) {
    return dst;
  }

  dst.resize(n);

  if (a.size() != b.size()) {
    return dst;
  }
  for (size_t i = 0; i < n; i++) {
    dst[i] = lerp(a[i], b[i], t);
  }

  return dst;
}